

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O2

void __thiscall Polynom<Complex>::Polynom(Polynom<Complex> *this,Complex *f)

{
  Matrix<Complex>::Matrix(&this->m,1,1);
  Complex::operator=((this->m).arr,f);
  return;
}

Assistant:

explicit Polynom(const Field &f): m(1, 1)
    {
        m[0][0] = f;
    }